

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
DensityCalculator<long_double,double>::initialize_bdens<InputData<double,long>>
          (DensityCalculator<long_double,double> *this,InputData<double,_long> *input_data,
          ModelParams *model_params,vector<unsigned_long,_std::allocator<unsigned_long>_> *ix_arr,
          ColumnSampler<long_double> *col_sampler)

{
  DensityCalculator<long_double,double> DVar1;
  size_t sVar2;
  size_t *psVar3;
  long lVar4;
  bool bVar5;
  longdouble *plVar6;
  size_t sVar7;
  double *in_R9;
  long lVar8;
  unkbyte10 in_ST0;
  unkbyte10 Var9;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  bool unsplittable;
  ModelParams *local_78;
  size_t col;
  DensityCalculator<long_double,double> *local_68;
  size_t npresent;
  vector<signed_char,_std::allocator<signed_char>_> categ_present;
  
  DVar1 = (DensityCalculator<long_double,double>)model_params->fast_bratio;
  this[0x90] = DVar1;
  local_78 = model_params;
  if (DVar1 == (DensityCalculator<long_double,double>)0x1) {
    std::vector<long_double,_std::allocator<long_double>_>::reserve
              ((vector<long_double,_std::allocator<long_double>_> *)this,model_params->max_depth + 3
              );
    categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = SUB108((longdouble)0,0);
    categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_2_ = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    std::vector<long_double,_std::allocator<long_double>_>::emplace_back<long_double>
              ((vector<long_double,_std::allocator<long_double>_> *)this,
               (longdouble *)&categ_present);
  }
  if (input_data->ncat_ == (int *)0x0 && input_data->range_low == (double *)0x0) {
    if (input_data->ncols_numeric != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)(this + 0x78),local_78->max_depth + 3);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(this + 0x48),input_data->ncols_numeric)
      ;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(this + 0x60),input_data->ncols_numeric)
      ;
      if (this[0x90] == (DensityCalculator<long_double,double>)0x0) {
        std::vector<long_double,_std::allocator<long_double>_>::resize
                  ((vector<long_double,_std::allocator<long_double>_> *)(this + 0x98),
                   input_data->ncols_numeric);
      }
    }
    if (input_data->ncols_categ == 0) {
      unsplittable = false;
      npresent = 0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_2_ = 0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish._2_6_ = 0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)(this + 200),local_78->max_depth + 2);
      npresent = 0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unsplittable = false;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_2_ = 0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish._2_6_ = 0;
      if (input_data->ncols_categ != 0) {
        std::vector<signed_char,_std::allocator<signed_char>_>::resize
                  (&categ_present,(long)input_data->max_categ);
      }
    }
    ColumnSampler<long_double>::prepare_full_pass(col_sampler);
    local_68 = this + 0xb0;
    while( true ) {
      bVar5 = ColumnSampler<long_double>::sample_col(col_sampler,&col);
      if (!bVar5) break;
      if (col < input_data->ncols_numeric) {
        psVar3 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if (input_data->Xc_indptr == (long *)0x0) {
          in_R9 = (double *)(*(long *)(this + 0x48) + col * 8);
          get_range<double>(psVar3,input_data->numeric_data + input_data->nrows * col,0,
                            ((long)(ix_arr->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 3)
                            - 1,local_78->missing_action,in_R9,
                            (double *)(col * 8 + *(long *)(this + 0x60)),&unsplittable);
          Var9 = in_ST0;
        }
        else {
          in_R9 = (double *)input_data->Xc_ind;
          get_range<double,long>
                    (psVar3,0,((long)(ix_arr->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 3
                              ) - 1,col,input_data->Xc,(long *)in_R9,input_data->Xc_indptr,
                     local_78->missing_action,(double *)(*(long *)(this + 0x48) + col * 8),
                     (double *)(col * 8 + *(long *)(this + 0x60)),&unsplittable);
          Var9 = in_ST0;
        }
        if (unsplittable == true) {
          *(undefined8 *)(*(long *)(this + 0x48) + col * 8) = 0;
          *(undefined8 *)(*(long *)(this + 0x60) + col * 8) = 0;
          if (this[0x90] == (DensityCalculator<long_double,double>)0x0) {
            *(longdouble *)(*(long *)(this + 0x98) + col * 0x10) = (longdouble)0;
          }
          ColumnSampler<long_double>::drop_col(col_sampler,col);
        }
        in_ST0 = Var9;
        if (this[0x90] == (DensityCalculator<long_double,double>)0x0) {
          lVar4 = *(long *)(this + 0x98);
          lVar8 = col * 0x10;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          fmaxl();
          *(unkbyte10 *)(lVar4 + lVar8) = Var9;
        }
      }
      else {
        psVar3 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        get_categs(psVar3,input_data->categ_data +
                          (col - input_data->ncols_numeric) * input_data->nrows,0,
                   ((long)(ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 3) - 1,
                   input_data->ncat[col],(MissingAction)in_R9,
                   categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,&npresent,&unsplittable);
        if (unsplittable == true) {
          *(undefined4 *)(*(long *)local_68 + (col - input_data->ncols_numeric) * 4) = 1;
          ColumnSampler<long_double>::drop_col(col_sampler,col);
        }
        else {
          *(undefined4 *)(*(long *)local_68 + (col - input_data->ncols_numeric) * 4) =
               (undefined4)npresent;
        }
      }
    }
    if (this[0x90] == (DensityCalculator<long_double,double>)0x0) {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(this + 0xe0),
                 (vector<int,_std::allocator<int>_> *)local_68);
    }
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              (&categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  }
  else {
    if (input_data->ncols_numeric != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)(this + 0x78),local_78->max_depth + 3);
      std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                ((vector<double,std::allocator<double>> *)(this + 0x48),input_data->range_low,
                 input_data->range_low + input_data->ncols_numeric);
      std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                ((vector<double,std::allocator<double>> *)(this + 0x60),input_data->range_high,
                 input_data->range_high + input_data->ncols_numeric);
    }
    if (input_data->ncols_categ != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)(this + 200),local_78->max_depth + 2);
      std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
                ((vector<int,std::allocator<int>> *)(this + 0xb0),input_data->ncat_,
                 input_data->ncat_ + input_data->ncols_categ);
    }
    if (this[0x90] == (DensityCalculator<long_double,double>)0x0) {
      if (input_data->ncols_numeric != 0) {
        std::vector<long_double,_std::allocator<long_double>_>::resize
                  ((vector<long_double,_std::allocator<long_double>_> *)(this + 0x98),
                   input_data->ncols_numeric);
        sVar2 = input_data->ncols_numeric;
        lVar4 = *(long *)(this + 0x48);
        lVar8 = *(long *)(this + 0x60);
        plVar6 = *(longdouble **)(this + 0x98);
        for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
          *plVar6 = (longdouble)(*(double *)(lVar8 + sVar7 * 8) - *(double *)(lVar4 + sVar7 * 8));
          plVar6 = plVar6 + 1;
        }
      }
      if (input_data->ncols_categ != 0) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)(this + 0xe0),
                   (vector<int,_std::allocator<int>_> *)(this + 0xb0));
      }
    }
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize_bdens(const InputData &input_data,
                                         const ModelParams &model_params,
                                         std::vector<size_t> &ix_arr,
                                         ColumnSampler<ldouble_safe> &col_sampler)
{
    this->fast_bratio = model_params.fast_bratio;
    if (this->fast_bratio)
    {
        this->multipliers.reserve(model_params.max_depth + 3);
        this->multipliers.push_back(0);
    }

    if (input_data.range_low != NULL || input_data.ncat_ != NULL)
    {
        if (input_data.ncols_numeric)
        {
            this->queue_box.reserve(model_params.max_depth+3);
            this->box_low.assign(input_data.range_low, input_data.range_low + input_data.ncols_numeric);
            this->box_high.assign(input_data.range_high, input_data.range_high + input_data.ncols_numeric);
        }

        if (input_data.ncols_categ)
        {
            this->queue_ncat.reserve(model_params.max_depth+2);
            this->ncat.assign(input_data.ncat_, input_data.ncat_ + input_data.ncols_categ);
        }

        if (!this->fast_bratio)
        {
            if (input_data.ncols_numeric)
            {
                this->ranges.resize(input_data.ncols_numeric);
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                    this->ranges[col] = this->box_high[col] - this->box_low[col];
            }

            if (input_data.ncols_categ)
            {
                this->ncat_orig = this->ncat;
            }
        }

        return;
    }

    if (input_data.ncols_numeric)
    {
        this->queue_box.reserve(model_params.max_depth+3);
        this->box_low.resize(input_data.ncols_numeric);
        this->box_high.resize(input_data.ncols_numeric);
        if (!this->fast_bratio)
            this->ranges.resize(input_data.ncols_numeric);
    }
    if (input_data.ncols_categ)
    {
        this->queue_ncat.reserve(model_params.max_depth+2);
    }
    bool unsplittable = false;
    
    size_t npresent = 0;
    std::vector<signed char> categ_present;
    if (input_data.ncols_categ)
    {
        categ_present.resize(input_data.max_categ);
    }


    col_sampler.prepare_full_pass();
    size_t col;
    while (col_sampler.sample_col(col))
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr != NULL)
            {
                get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
                          input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            else
            {
                get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }


            if (unsplittable)
            {
                this->box_low[col] = 0;
                this->box_high[col] = 0;
                if (!this->fast_bratio)
                    this->ranges[col] = 0;
                col_sampler.drop_col(col);
            }

            if (!this->fast_bratio)
            {
                this->ranges[col] = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
                this->ranges[col] = std::fmax(this->ranges[col], (ldouble_safe)0);
            }
        }

        else
        {
            get_categs((size_t*)ix_arr.data(),
                       input_data.categ_data + input_data.nrows * (col - input_data.ncols_numeric),
                       (size_t)0, ix_arr.size()-(size_t)1, input_data.ncat[col],
                       model_params.missing_action, categ_present.data(), npresent, unsplittable);

            if (unsplittable)
            {
                this->ncat[col - input_data.ncols_numeric] = 1;
                col_sampler.drop_col(col);
            }

            else
            {
                this->ncat[col - input_data.ncols_numeric] = npresent;
            }
        }
    }

    if (!this->fast_bratio)
        this->ncat_orig = this->ncat;
}